

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint flag)

{
  int *piVar1;
  Prog *pPVar2;
  Inst *pIVar3;
  bool bVar4;
  uint uVar5;
  EmptyOp EVar6;
  uint i;
  ostream *this_00;
  int iVar7;
  ulong uVar8;
  LogMessageFatal local_1b0;
  
  piVar1 = this->astack_;
  *piVar1 = id;
  uVar8 = 1;
LAB_0013d979:
  iVar7 = (int)uVar8;
  if (iVar7 < 1) {
    return;
  }
  if (this->nastack_ < iVar7) {
    __assert_fail("(nstk) <= (nastack_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                  0x32e,"void re2::DFA::AddToQueue(Workq *, int, uint)");
  }
  uVar8 = (ulong)(iVar7 - 1);
  i = piVar1[uVar8];
LAB_0013d998:
  do {
    if (i == 0) goto LAB_0013d979;
    if (i == 0xffffffff) {
      Workq::mark(q);
      goto LAB_0013d979;
    }
    bVar4 = SparseSet::contains(&q->super_SparseSet,i);
    if (bVar4) goto LAB_0013d979;
    Workq::insert_new(q,i);
    pPVar2 = this->prog_;
    pIVar3 = pPVar2->inst_;
    uVar5 = pIVar3[(int)i].out_opcode_;
    if (5 < (uVar5 & 7) - 1) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x347
                );
      this_00 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"unhandled opcode: ");
      std::ostream::operator<<(this_00,pIVar3[(int)i].out_opcode_ & 7);
      LogMessageFatal::~LogMessageFatal(&local_1b0);
      goto LAB_0013d979;
    }
    iVar7 = (int)uVar8;
    switch(uVar5 & 7) {
    case 1:
      if ((uVar5 & 8) != 0) {
        __assert_fail("!ip->last()",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                      0x361,"void re2::DFA::AddToQueue(Workq *, int, uint)");
      }
      i = i + 1;
      goto LAB_0013d998;
    default:
      goto switchD_0013d9f0_caseD_2;
    case 3:
    case 6:
      if ((uVar5 & 8) == 0) {
        uVar8 = (ulong)(iVar7 + 1);
        piVar1[iVar7] = i + 1;
        uVar5 = pIVar3[(int)i].out_opcode_;
      }
      if (((((uVar5 & 7) == 6) && (0 < q->maxmark_)) && (i == pPVar2->start_unanchored_)) &&
         (i != pPVar2->start_)) {
        iVar7 = (int)uVar8;
        uVar8 = (ulong)(iVar7 + 1);
        piVar1[iVar7] = -1;
        goto LAB_0013da87;
      }
      break;
    case 4:
      if ((uVar5 & 8) == 0) {
        uVar8 = (ulong)(iVar7 + 1);
        piVar1[iVar7] = i + 1;
      }
      EVar6 = Prog::Inst::empty(pIVar3 + (int)i);
      if ((~flag & EVar6) != 0) goto LAB_0013d979;
LAB_0013da87:
      uVar5 = pIVar3[(int)i].out_opcode_;
    }
    i = uVar5 >> 4;
  } while( true );
switchD_0013d9f0_caseD_2:
  i = i + ((uVar5 & 8) >> 3 ^ 1);
  if ((uVar5 & 8) != 0) goto LAB_0013d979;
  goto LAB_0013d998;
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint flag) {

  // Use astack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = astack_;
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, nastack_);
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}